

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmyblas2.c
# Opt level: O0

void dmatvec(int ldm,int nrow,int ncol,double *M,double *vec,double *Mxvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int local_c0;
  int local_bc;
  int k;
  int firstcol;
  double *Mki7;
  double *Mki6;
  double *Mki5;
  double *Mki4;
  double *Mki3;
  double *Mki2;
  double *Mki1;
  double *Mki0;
  double *M0;
  double vi7;
  double vi6;
  double vi5;
  double vi4;
  double vi3;
  double vi2;
  double vi1;
  double vi0;
  double *Mxvec_local;
  double *vec_local;
  double *M_local;
  int ncol_local;
  int nrow_local;
  int ldm_local;
  
  local_bc = 0;
  Mki0 = M;
  while (local_bc < ncol + -7) {
    Mki1 = Mki0;
    Mki2 = Mki0 + ldm;
    Mki3 = Mki2 + ldm;
    Mki4 = Mki3 + ldm;
    Mki5 = Mki4 + ldm;
    Mki6 = Mki5 + ldm;
    dVar1 = vec[local_bc];
    dVar2 = vec[local_bc + 1];
    dVar3 = vec[local_bc + 2];
    dVar4 = vec[local_bc + 3];
    dVar5 = vec[local_bc + 4];
    dVar6 = vec[local_bc + 5];
    iVar9 = local_bc + 7;
    dVar7 = vec[local_bc + 6];
    local_bc = local_bc + 8;
    dVar8 = vec[iVar9];
    _k = Mki6 + ldm + ldm;
    Mki7 = Mki6 + ldm;
    for (local_c0 = 0; local_c0 < nrow; local_c0 = local_c0 + 1) {
      Mxvec[local_c0] =
           dVar8 * *_k +
           dVar7 * *Mki7 +
           dVar6 * *Mki6 +
           dVar5 * *Mki5 + dVar4 * *Mki4 + dVar3 * *Mki3 + dVar1 * *Mki1 + dVar2 * *Mki2 +
           Mxvec[local_c0];
      _k = _k + 1;
      Mki7 = Mki7 + 1;
      Mki6 = Mki6 + 1;
      Mki5 = Mki5 + 1;
      Mki4 = Mki4 + 1;
      Mki3 = Mki3 + 1;
      Mki2 = Mki2 + 1;
      Mki1 = Mki1 + 1;
    }
    Mki0 = Mki0 + (ldm << 3);
  }
  while (local_bc < ncol + -3) {
    Mki1 = Mki0;
    Mki2 = Mki0 + ldm;
    dVar1 = vec[local_bc];
    dVar2 = vec[local_bc + 1];
    iVar9 = local_bc + 3;
    dVar3 = vec[local_bc + 2];
    local_bc = local_bc + 4;
    dVar4 = vec[iVar9];
    Mki4 = Mki2 + ldm + ldm;
    Mki3 = Mki2 + ldm;
    for (local_c0 = 0; local_c0 < nrow; local_c0 = local_c0 + 1) {
      Mxvec[local_c0] =
           dVar4 * *Mki4 + dVar3 * *Mki3 + dVar1 * *Mki1 + dVar2 * *Mki2 + Mxvec[local_c0];
      Mki4 = Mki4 + 1;
      Mki3 = Mki3 + 1;
      Mki2 = Mki2 + 1;
      Mki1 = Mki1 + 1;
    }
    Mki0 = Mki0 + (ldm << 2);
  }
  while (local_bc < ncol) {
    Mki1 = Mki0;
    dVar1 = vec[local_bc];
    for (local_c0 = 0; local_c0 < nrow; local_c0 = local_c0 + 1) {
      Mxvec[local_c0] = dVar1 * *Mki1 + Mxvec[local_c0];
      Mki1 = Mki1 + 1;
    }
    Mki0 = Mki0 + ldm;
    local_bc = local_bc + 1;
  }
  return;
}

Assistant:

void dmatvec (int ldm, int nrow, int ncol, double *M, double *vec, double *Mxvec)
{
    double vi0, vi1, vi2, vi3, vi4, vi5, vi6, vi7;
    double *M0;
    register double *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;
    int k;

    M0 = &M[0];
    while ( firstcol < ncol - 7 ) {	/* Do 8 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
        Mki2 = Mki1 + ldm;
        Mki3 = Mki2 + ldm;
	Mki4 = Mki3 + ldm;
	Mki5 = Mki4 + ldm;
	Mki6 = Mki5 + ldm;
	Mki7 = Mki6 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	vi4 = vec[firstcol++];
	vi5 = vec[firstcol++];
	vi6 = vec[firstcol++];
	vi7 = vec[firstcol++];	

	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ 
		      + vi4 * *Mki4++ + vi5 * *Mki5++
		      + vi6 * *Mki6++ + vi7 * *Mki7++;

	M0 += 8 * ldm;
    }

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ ;

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */

 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++)
	    Mxvec[k] += vi0 * *Mki0++;

	M0 += ldm;
    }
	
}